

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O1

void __thiscall RTIMU::calibrateAverageCompass(RTIMU *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  RTIMUSettings *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  RTVector3 ev;
  RTVector3 local_20;
  
  bVar4 = this->m_compassCalibrationMode;
  if (bVar4 == false) {
    if (this->m_settings->m_compassCalValid == false) {
      fVar13 = (this->m_imuData).compass.m_data[0];
      bVar6 = fVar13 == this->m_runtimeMagCalMax[0];
      bVar9 = fVar13 < this->m_runtimeMagCalMax[0];
      if (!bVar9 && !bVar6) {
        this->m_runtimeMagCalMax[0] = fVar13;
      }
      fVar14 = (this->m_imuData).compass.m_data[1];
      bVar7 = fVar14 == this->m_runtimeMagCalMax[1];
      bVar10 = fVar14 < this->m_runtimeMagCalMax[1];
      if (!bVar10 && !bVar7) {
        this->m_runtimeMagCalMax[1] = fVar14;
      }
      fVar14 = (this->m_imuData).compass.m_data[2];
      bVar8 = fVar14 == this->m_runtimeMagCalMax[2];
      bVar11 = fVar14 < this->m_runtimeMagCalMax[2];
      if (!bVar11 && !bVar8) {
        this->m_runtimeMagCalMax[2] = fVar14;
      }
      fVar14 = this->m_runtimeMagCalMin[0];
      if (fVar13 < fVar14) {
        this->m_runtimeMagCalMin[0] = fVar13;
      }
      fVar1 = (this->m_imuData).compass.m_data[1];
      fVar2 = this->m_runtimeMagCalMin[1];
      if (fVar1 < fVar2) {
        this->m_runtimeMagCalMin[1] = fVar1;
      }
      fVar3 = (this->m_imuData).compass.m_data[2];
      if (this->m_runtimeMagCalMin[2] <= fVar3) {
        if (fVar2 <= fVar1 &&
            (fVar14 <= fVar13 && ((bVar11 || bVar8) && ((bVar10 || bVar7) && (bVar9 || bVar6)))))
        goto code_r0x00118489;
      }
      else {
        this->m_runtimeMagCalMin[2] = fVar3;
      }
      if (this->m_runtimeMagCalValid == false) {
        this->m_runtimeMagCalValid = true;
        lVar12 = -3;
        do {
          if (((this->m_runtimeMagCalMin[lVar12] < 0.0) ||
              (fVar13 = this[1].m_imuData.fusionPose.m_data[lVar12 + -7], 0.0 < fVar13)) ||
             (this->m_runtimeMagCalMin[lVar12] - fVar13 < 30.0)) {
            this->m_runtimeMagCalValid = false;
            break;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
      }
      if (this->m_runtimeMagCalValid == true) {
        fVar13 = -1.0;
        lVar12 = -3;
        do {
          fVar14 = this->m_runtimeMagCalMin[lVar12] -
                   this[1].m_imuData.fusionPose.m_data[lVar12 + -7];
          if (fVar14 <= fVar13) {
            fVar14 = fVar13;
          }
          fVar13 = fVar14;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
        lVar12 = -3;
        do {
          fVar14 = this->m_runtimeMagCalMin[lVar12];
          fVar1 = this[1].m_imuData.fusionPose.m_data[lVar12 + -7];
          (this->m_compassAverage).m_data[lVar12] = (fVar13 * 0.5) / ((fVar14 - fVar1) * 0.5);
          this->m_compassCalScale[lVar12] = (fVar14 + fVar1) * 0.5;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
      }
    }
code_r0x00118489:
    if (this->m_settings->m_compassCalValid == false) goto LAB_00118496;
  }
  else {
LAB_00118496:
    if ((bVar4 != false) || ((this->m_runtimeMagCalValid & 1U) == 0)) goto LAB_001185b6;
  }
  fVar13 = (this->m_imuData).compass.m_data[1];
  (this->m_imuData).compass.m_data[0] =
       ((this->m_imuData).compass.m_data[0] - this->m_compassCalOffset[0]) *
       this->m_compassCalScale[0];
  (this->m_imuData).compass.m_data[1] =
       (fVar13 - this->m_compassCalOffset[1]) * this->m_compassCalScale[1];
  (this->m_imuData).compass.m_data[2] =
       ((this->m_imuData).compass.m_data[2] - this->m_compassCalOffset[2]) *
       this->m_compassCalScale[2];
  if (this->m_settings->m_compassCalEllipsoidValid == true) {
    local_20.m_data[2] = (this->m_imuData).compass.m_data[2];
    local_20.m_data._0_8_ = *(undefined8 *)(this->m_imuData).compass.m_data;
    RTVector3::operator-=(&local_20,&this->m_settings->m_compassCalEllipsoidOffset);
    pRVar5 = this->m_settings;
    (this->m_imuData).compass.m_data[0] =
         pRVar5->m_compassCalEllipsoidCorr[0][2] * local_20.m_data[2] +
         pRVar5->m_compassCalEllipsoidCorr[0][0] * local_20.m_data[0] +
         pRVar5->m_compassCalEllipsoidCorr[0][1] * local_20.m_data[1];
    (this->m_imuData).compass.m_data[1] =
         pRVar5->m_compassCalEllipsoidCorr[1][2] * local_20.m_data[2] +
         pRVar5->m_compassCalEllipsoidCorr[1][0] * local_20.m_data[0] +
         pRVar5->m_compassCalEllipsoidCorr[1][1] * local_20.m_data[1];
    (this->m_imuData).compass.m_data[2] =
         local_20.m_data[2] * pRVar5->m_compassCalEllipsoidCorr[2][2] +
         local_20.m_data[0] * pRVar5->m_compassCalEllipsoidCorr[2][0] +
         local_20.m_data[1] * pRVar5->m_compassCalEllipsoidCorr[2][1];
  }
LAB_001185b6:
  (this->m_compassAverage).m_data[0] =
       (this->m_compassAverage).m_data[0] * 0.8 + (this->m_imuData).compass.m_data[0] * 0.2;
  (this->m_compassAverage).m_data[1] =
       (this->m_compassAverage).m_data[1] * 0.8 + (this->m_imuData).compass.m_data[1] * 0.2;
  (this->m_compassAverage).m_data[2] =
       (this->m_compassAverage).m_data[2] * 0.8 + (this->m_imuData).compass.m_data[2] * 0.2;
  RTVector3::operator=(&(this->m_imuData).compass,&this->m_compassAverage);
  return;
}

Assistant:

void RTIMU::calibrateAverageCompass()
{
    //  see if need to do runtime mag calibration (i.e. no stored calibration data)

    if (!m_compassCalibrationMode && !m_settings->m_compassCalValid) {
        // try runtime calibration
        bool changed = false;

        // see if there is a new max or min

        if (m_runtimeMagCalMax[0] < m_imuData.compass.x()) {
            m_runtimeMagCalMax[0] = m_imuData.compass.x();
            changed = true;
        }
        if (m_runtimeMagCalMax[1] < m_imuData.compass.y()) {
            m_runtimeMagCalMax[1] = m_imuData.compass.y();
            changed = true;
        }
        if (m_runtimeMagCalMax[2] < m_imuData.compass.z()) {
            m_runtimeMagCalMax[2] = m_imuData.compass.z();
            changed = true;
        }

        if (m_runtimeMagCalMin[0] > m_imuData.compass.x()) {
            m_runtimeMagCalMin[0] = m_imuData.compass.x();
            changed = true;
        }
        if (m_runtimeMagCalMin[1] > m_imuData.compass.y()) {
            m_runtimeMagCalMin[1] = m_imuData.compass.y();
            changed = true;
        }
        if (m_runtimeMagCalMin[2] > m_imuData.compass.z()) {
            m_runtimeMagCalMin[2] = m_imuData.compass.z();
            changed = true;
        }

        //  now see if ranges are sufficient

        if (changed) {

            float delta;

            if (!m_runtimeMagCalValid) {
                m_runtimeMagCalValid = true;

                for (int i = 0; i < 3; i++)
                {
                    delta = m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i];
                    if ((delta < RTIMU_RUNTIME_MAGCAL_RANGE) || (m_runtimeMagCalMin[i] > 0) || (m_runtimeMagCalMax[i] < 0))
                    {
                        m_runtimeMagCalValid = false;
                        break;
                    }
                }
            }

            //  find biggest range and scale to that

            if (m_runtimeMagCalValid) {
                float magMaxDelta = -1;

                for (int i = 0; i < 3; i++) {
                    if ((m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i]) > magMaxDelta)
                    {
                        magMaxDelta = m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i];
                    }
                }

                // adjust for + and - range

                magMaxDelta /= 2.0;

                for (int i = 0; i < 3; i++)
                {
                    delta = (m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i]) / 2.0;
                    m_compassCalScale[i] = magMaxDelta / delta;
                    m_compassCalOffset[i] = (m_runtimeMagCalMax[i] + m_runtimeMagCalMin[i]) / 2.0;
                }
            }
        }
    }

    if (getCompassCalibrationValid() || getRuntimeCompassCalibrationValid()) {
        m_imuData.compass.setX((m_imuData.compass.x() - m_compassCalOffset[0]) * m_compassCalScale[0]);
        m_imuData.compass.setY((m_imuData.compass.y() - m_compassCalOffset[1]) * m_compassCalScale[1]);
        m_imuData.compass.setZ((m_imuData.compass.z() - m_compassCalOffset[2]) * m_compassCalScale[2]);

        if (m_settings->m_compassCalEllipsoidValid) {
            RTVector3 ev = m_imuData.compass;
            ev -= m_settings->m_compassCalEllipsoidOffset;

            m_imuData.compass.setX(ev.x() * m_settings->m_compassCalEllipsoidCorr[0][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[0][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[0][2]);

            m_imuData.compass.setY(ev.x() * m_settings->m_compassCalEllipsoidCorr[1][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[1][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[1][2]);

            m_imuData.compass.setZ(ev.x() * m_settings->m_compassCalEllipsoidCorr[2][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[2][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[2][2]);
        }
    }

    //  update running average

    m_compassAverage.setX(m_imuData.compass.x() * COMPASS_ALPHA + m_compassAverage.x() * (1.0 - COMPASS_ALPHA));
    m_compassAverage.setY(m_imuData.compass.y() * COMPASS_ALPHA + m_compassAverage.y() * (1.0 - COMPASS_ALPHA));
    m_compassAverage.setZ(m_imuData.compass.z() * COMPASS_ALPHA + m_compassAverage.z() * (1.0 - COMPASS_ALPHA));

    m_imuData.compass = m_compassAverage;
}